

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void analyzeOneTable(Parse *pParse,Table *pTab,Index *pOnlyIdx,int iStatCur,int iMem,int iTab)

{
  ushort uVar1;
  sqlite3 *db_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  Vdbe *p;
  long in_RDX;
  long in_RSI;
  Parse *in_RDI;
  int in_R8D;
  int in_R9D;
  int j3;
  int j2;
  int j1;
  char *pColl;
  int *aGotoChng;
  int endDistinctTest;
  int nColTest;
  char *zIdxName;
  int addrNextRow;
  int addrGotoEnd;
  int nCol;
  int regPrev;
  int regStat1;
  int regIdxname;
  int regTabname;
  int regTemp2;
  int regTemp;
  int regRowid;
  int regChng;
  int regStat;
  int regNewRowid;
  u8 needTableCnt;
  int iDb;
  int jZeroRows;
  int i;
  Vdbe *v;
  int iTabCur;
  int iIdxCur;
  Index *pIdx;
  sqlite3 *db;
  int in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  Pgno in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int iVar5;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Parse *in_stack_ffffffffffffff50;
  Parse *in_stack_ffffffffffffff58;
  int local_9c;
  int in_stack_ffffffffffffff70;
  int local_88;
  int local_4c;
  long local_38;
  
  db_00 = in_RDI->db;
  bVar2 = true;
  sqlite3TouchRegister(in_RDI,in_R8D + 9);
  p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if ((((p != (Vdbe *)0x0) && (in_RSI != 0)) && (*(char *)(in_RSI + 0x3f) == '\0')) &&
     (iVar3 = sqlite3_strlike((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              in_stack_ffffffffffffff2c), iVar3 != 0)) {
    sqlite3SchemaToIndex(db_00,*(Schema **)(in_RSI + 0x60));
    iVar3 = sqlite3AuthCheck(in_stack_ffffffffffffff58,
                             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (iVar3 == 0) {
      sqlite3TableLock((Parse *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                       (u8)((uint)in_stack_ffffffffffffff34 >> 0x18),
                       (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      iVar3 = in_R9D + 2;
      if (iVar3 < in_RDI->nTab) {
        iVar3 = in_RDI->nTab;
      }
      in_RDI->nTab = iVar3;
      sqlite3OpenTable(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                       ,(Table *)CONCAT44(in_stack_ffffffffffffff44,iVar3),in_stack_ffffffffffffff3c
                      );
      sqlite3VdbeLoadString
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,iVar3),in_stack_ffffffffffffff3c,
                 (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      for (local_38 = *(long *)(in_RSI + 0x10); local_38 != 0; local_38 = *(long *)(local_38 + 0x28)
          ) {
        if ((in_RDX == 0) || (in_RDX == local_38)) {
          if (*(long *)(local_38 + 0x48) == 0) {
            bVar2 = false;
          }
          if (((*(uint *)(in_RSI + 0x30) & 0x80) == 0) || ((*(ushort *)(local_38 + 99) & 3) != 2)) {
            uVar1 = *(ushort *)(local_38 + 0x60);
            if ((*(ushort *)(local_38 + 99) >> 3 & 1) != 0) {
              uVar1 = *(ushort *)(local_38 + 0x5e);
            }
            in_stack_ffffffffffffff3c = uVar1 - 1;
            local_9c = in_stack_ffffffffffffff3c;
          }
          else {
            local_9c = *(ushort *)(local_38 + 0x5e) - 1;
          }
          sqlite3VdbeLoadString
                    ((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,iVar3),in_stack_ffffffffffffff3c,
                     (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          sqlite3TouchRegister(in_RDI,in_R8D + 9 + local_9c);
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff44,iVar3,in_stack_ffffffffffffff3c,
                            in_stack_ffffffffffffff38);
          sqlite3VdbeSetP4KeyInfo
                    ((Parse *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                     (Index *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff44,iVar3,in_stack_ffffffffffffff3c,
                            in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff28 = 0;
          sqlite3VdbeAddFunctionCall
                    (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     (int)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                     in_stack_ffffffffffffff48,(FuncDef *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                     in_stack_ffffffffffffff70);
          local_88 = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,
                                                        in_stack_ffffffffffffff30),
                                       in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
          sqlite3VdbeCurrentAddr(p);
          if (0 < local_9c) {
            sqlite3VdbeMakeLabel(in_RDI);
            in_stack_ffffffffffffff58 =
                 (Parse *)sqlite3DbMallocRawNN
                                    ((sqlite3 *)
                                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
            if (in_stack_ffffffffffffff58 == (Parse *)0x0) goto LAB_00221f5f;
            sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              in_stack_ffffffffffffff2c);
            sqlite3VdbeCurrentAddr(p);
            if (((local_9c == 1) && (*(short *)(local_38 + 0x5e) == 1)) &&
               (*(char *)(local_38 + 0x62) != '\0')) {
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c,
                                in_stack_ffffffffffffff28,0);
            }
            for (local_4c = 0; local_4c < local_9c; local_4c = local_4c + 1) {
              in_stack_ffffffffffffff50 =
                   (Parse *)sqlite3LocateCollSeq
                                      ((Parse *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                                       (char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                        in_stack_ffffffffffffff38));
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c,
                                in_stack_ffffffffffffff28,0);
              sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ),in_stack_ffffffffffffff44,iVar3,
                                in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
              in_stack_ffffffffffffff28 = -2;
              iVar4 = sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                                        in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                                        in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                                        (char *)CONCAT44(in_stack_ffffffffffffff2c,0xfffffffe),
                                        (int)in_stack_ffffffffffffff50);
              *(int *)((long)&in_stack_ffffffffffffff58->db + (long)local_4c * 4) = iVar4;
              sqlite3VdbeChangeP5(p,0x80);
            }
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
            sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c);
            for (local_4c = 0; local_4c < local_9c; local_4c = local_4c + 1) {
              sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30),
                                  in_stack_ffffffffffffff2c);
              sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ),in_stack_ffffffffffffff44,iVar3,
                                in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
            }
            sqlite3VdbeResolveLabel
                      ((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,iVar3),in_stack_ffffffffffffff3c);
            sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          }
          iVar4 = 0;
          sqlite3VdbeAddFunctionCall
                    (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     (int)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                     in_stack_ffffffffffffff48,(FuncDef *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                     in_stack_ffffffffffffff70);
          if (db_00->nAnalysisLimit == 0) {
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              in_stack_ffffffffffffff2c,iVar4,0);
          }
          else {
            iVar5 = -0x55555556;
            in_stack_ffffffffffffff4c =
                 sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff2c,iVar4);
            in_stack_ffffffffffffff48 =
                 sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff2c,iVar4);
            in_stack_ffffffffffffff44 =
                 sqlite3VdbeAddOp4Int
                           ((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            iVar5,iVar3,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff34);
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c);
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              in_stack_ffffffffffffff2c,iVar4,0);
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c);
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c);
          }
          if (*(long *)(local_38 + 0x48) != 0) {
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c);
            local_88 = 0;
          }
          callStatGet((Parse *)CONCAT44(in_stack_ffffffffffffff44,iVar3),in_stack_ffffffffffffff3c,
                      in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
          in_stack_ffffffffffffff28 = 0;
          sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                            in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                            (char *)((ulong)in_stack_ffffffffffffff2c << 0x20),
                            (int)in_stack_ffffffffffffff50);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff44,iVar3,in_stack_ffffffffffffff3c,
                            in_stack_ffffffffffffff38);
          sqlite3VdbeChangeP5(p,8);
          if (local_88 != 0) {
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff2c);
          }
        }
LAB_00221f5f:
      }
      if ((in_RDX == 0) && (bVar2)) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
        iVar5 = (int)in_stack_ffffffffffffff50;
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
        iVar4 = 0;
        sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
                          in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                          (char *)((ulong)in_stack_ffffffffffffff2c << 0x20),iVar5);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c,iVar4,0);
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          in_stack_ffffffffffffff44,iVar3,in_stack_ffffffffffffff3c,
                          in_stack_ffffffffffffff38);
        sqlite3VdbeChangeP5(p,8);
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
      }
    }
  }
  return;
}

Assistant:

static void analyzeOneTable(
  Parse *pParse,   /* Parser context */
  Table *pTab,     /* Table whose indices are to be analyzed */
  Index *pOnlyIdx, /* If not NULL, only analyze this one index */
  int iStatCur,    /* Index of VdbeCursor that writes the sqlite_stat1 table */
  int iMem,        /* Available memory locations begin here */
  int iTab         /* Next available cursor */
){
  sqlite3 *db = pParse->db;    /* Database handle */
  Index *pIdx;                 /* An index to being analyzed */
  int iIdxCur;                 /* Cursor open on index being analyzed */
  int iTabCur;                 /* Table cursor */
  Vdbe *v;                     /* The virtual machine being built up */
  int i;                       /* Loop counter */
  int jZeroRows = -1;          /* Jump from here if number of rows is zero */
  int iDb;                     /* Index of database containing pTab */
  u8 needTableCnt = 1;         /* True to count the table */
  int regNewRowid = iMem++;    /* Rowid for the inserted record */
  int regStat = iMem++;        /* Register to hold StatAccum object */
  int regChng = iMem++;        /* Index of changed index field */
  int regRowid = iMem++;       /* Rowid argument passed to stat_push() */
  int regTemp = iMem++;        /* Temporary use register */
  int regTemp2 = iMem++;       /* Second temporary use register */
  int regTabname = iMem++;     /* Register containing table name */
  int regIdxname = iMem++;     /* Register containing index name */
  int regStat1 = iMem++;       /* Value for the stat column of sqlite_stat1 */
  int regPrev = iMem;          /* MUST BE LAST (see below) */
#ifdef SQLITE_ENABLE_STAT4
  int doOnce = 1;              /* Flag for a one-time computation */
#endif
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
  Table *pStat1 = 0;
#endif

  sqlite3TouchRegister(pParse, iMem);
  assert( sqlite3NoTempsInRange(pParse, regNewRowid, iMem) );
  v = sqlite3GetVdbe(pParse);
  if( v==0 || NEVER(pTab==0) ){
    return;
  }
  if( !IsOrdinaryTable(pTab) ){
    /* Do not gather statistics on views or virtual tables */
    return;
  }
  if( sqlite3_strlike("sqlite\\_%", pTab->zName, '\\')==0 ){
    /* Do not gather statistics on system tables */
    return;
  }
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_ANALYZE, pTab->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
  if( db->xPreUpdateCallback ){
    pStat1 = (Table*)sqlite3DbMallocZero(db, sizeof(Table) + 13);
    if( pStat1==0 ) return;
    pStat1->zName = (char*)&pStat1[1];
    memcpy(pStat1->zName, "sqlite_stat1", 13);
    pStat1->nCol = 3;
    pStat1->iPKey = -1;
    sqlite3VdbeAddOp4(pParse->pVdbe, OP_Noop, 0, 0, 0,(char*)pStat1,P4_DYNAMIC);
  }
#endif

  /* Establish a read-lock on the table at the shared-cache level.
  ** Open a read-only cursor on the table. Also allocate a cursor number
  ** to use for scanning indexes (iIdxCur). No index cursor is opened at
  ** this time though.  */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
  iTabCur = iTab++;
  iIdxCur = iTab++;
  pParse->nTab = MAX(pParse->nTab, iTab);
  sqlite3OpenTable(pParse, iTabCur, iDb, pTab, OP_OpenRead);
  sqlite3VdbeLoadString(v, regTabname, pTab->zName);

  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int nCol;                     /* Number of columns in pIdx. "N" */
    int addrGotoEnd;               /* Address of "OP_Rewind iIdxCur" */
    int addrNextRow;              /* Address of "next_row:" */
    const char *zIdxName;         /* Name of the index */
    int nColTest;                 /* Number of columns to test for changes */

    if( pOnlyIdx && pOnlyIdx!=pIdx ) continue;
    if( pIdx->pPartIdxWhere==0 ) needTableCnt = 0;
    if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIdx) ){
      nCol = pIdx->nKeyCol;
      zIdxName = pTab->zName;
      nColTest = nCol - 1;
    }else{
      nCol = pIdx->nColumn;
      zIdxName = pIdx->zName;
      nColTest = pIdx->uniqNotNull ? pIdx->nKeyCol-1 : nCol-1;
    }

    /* Populate the register containing the index name. */
    sqlite3VdbeLoadString(v, regIdxname, zIdxName);
    VdbeComment((v, "Analysis for %s.%s", pTab->zName, zIdxName));

    /*
    ** Pseudo-code for loop that calls stat_push():
    **
    **   regChng = 0
    **   Rewind csr
    **   if eof(csr){
    **      stat_init() with count = 0;
    **      goto end_of_scan;
    **   }
    **   count()
    **   stat_init()
    **   goto chng_addr_0;
    **
    **  next_row:
    **   regChng = 0
    **   if( idx(0) != regPrev(0) ) goto chng_addr_0
    **   regChng = 1
    **   if( idx(1) != regPrev(1) ) goto chng_addr_1
    **   ...
    **   regChng = N
    **   goto chng_addr_N
    **
    **  chng_addr_0:
    **   regPrev(0) = idx(0)
    **  chng_addr_1:
    **   regPrev(1) = idx(1)
    **  ...
    **
    **  endDistinctTest:
    **   regRowid = idx(rowid)
    **   stat_push(P, regChng, regRowid)
    **   Next csr
    **   if !eof(csr) goto next_row;
    **
    **  end_of_scan:
    */

    /* Make sure there are enough memory cells allocated to accommodate
    ** the regPrev array and a trailing rowid (the rowid slot is required
    ** when building a record to insert into the sample column of
    ** the sqlite_stat4 table.  */
    sqlite3TouchRegister(pParse, regPrev+nColTest);

    /* Open a read-only cursor on the index being analyzed. */
    assert( iDb==sqlite3SchemaToIndex(db, pIdx->pSchema) );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iIdxCur, pIdx->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
    VdbeComment((v, "%s", pIdx->zName));

    /* Implementation of the following:
    **
    **   regChng = 0
    **   Rewind csr
    **   if eof(csr){
    **      stat_init() with count = 0;
    **      goto end_of_scan;
    **   }
    **   count()
    **   stat_init()
    **   goto chng_addr_0;
    */
    assert( regTemp2==regStat+4 );
    sqlite3VdbeAddOp2(v, OP_Integer, db->nAnalysisLimit, regTemp2);

    /* Arguments to stat_init():
    **    (1) the number of columns in the index including the rowid
    **        (or for a WITHOUT ROWID table, the number of PK columns),
    **    (2) the number of columns in the key without the rowid/pk
    **    (3) estimated number of rows in the index. */
    sqlite3VdbeAddOp2(v, OP_Integer, nCol, regStat+1);
    assert( regRowid==regStat+2 );
    sqlite3VdbeAddOp2(v, OP_Integer, pIdx->nKeyCol, regRowid);
    sqlite3VdbeAddOp3(v, OP_Count, iIdxCur, regTemp,
                      OptimizationDisabled(db, SQLITE_Stat4));
    sqlite3VdbeAddFunctionCall(pParse, 0, regStat+1, regStat, 4,
                               &statInitFuncdef, 0);
    addrGotoEnd = sqlite3VdbeAddOp1(v, OP_Rewind, iIdxCur);
    VdbeCoverage(v);

    sqlite3VdbeAddOp2(v, OP_Integer, 0, regChng);
    addrNextRow = sqlite3VdbeCurrentAddr(v);

    if( nColTest>0 ){
      int endDistinctTest = sqlite3VdbeMakeLabel(pParse);
      int *aGotoChng;               /* Array of jump instruction addresses */
      aGotoChng = sqlite3DbMallocRawNN(db, sizeof(int)*nColTest);
      if( aGotoChng==0 ) continue;

      /*
      **  next_row:
      **   regChng = 0
      **   if( idx(0) != regPrev(0) ) goto chng_addr_0
      **   regChng = 1
      **   if( idx(1) != regPrev(1) ) goto chng_addr_1
      **   ...
      **   regChng = N
      **   goto endDistinctTest
      */
      sqlite3VdbeAddOp0(v, OP_Goto);
      addrNextRow = sqlite3VdbeCurrentAddr(v);
      if( nColTest==1 && pIdx->nKeyCol==1 && IsUniqueIndex(pIdx) ){
        /* For a single-column UNIQUE index, once we have found a non-NULL
        ** row, we know that all the rest will be distinct, so skip
        ** subsequent distinctness tests. */
        sqlite3VdbeAddOp2(v, OP_NotNull, regPrev, endDistinctTest);
        VdbeCoverage(v);
      }
      for(i=0; i<nColTest; i++){
        char *pColl = (char*)sqlite3LocateCollSeq(pParse, pIdx->azColl[i]);
        sqlite3VdbeAddOp2(v, OP_Integer, i, regChng);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regTemp);
        analyzeVdbeCommentIndexWithColumnName(v,pIdx,i);
        aGotoChng[i] =
        sqlite3VdbeAddOp4(v, OP_Ne, regTemp, 0, regPrev+i, pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp2(v, OP_Integer, nColTest, regChng);
      sqlite3VdbeGoto(v, endDistinctTest);


      /*
      **  chng_addr_0:
      **   regPrev(0) = idx(0)
      **  chng_addr_1:
      **   regPrev(1) = idx(1)
      **  ...
      */
      sqlite3VdbeJumpHere(v, addrNextRow-1);
      for(i=0; i<nColTest; i++){
        sqlite3VdbeJumpHere(v, aGotoChng[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, i, regPrev+i);
        analyzeVdbeCommentIndexWithColumnName(v,pIdx,i);
      }
      sqlite3VdbeResolveLabel(v, endDistinctTest);
      sqlite3DbFree(db, aGotoChng);
    }

    /*
    **  chng_addr_N:
    **   regRowid = idx(rowid)            // STAT4 only
    **   stat_push(P, regChng, regRowid)  // 3rd parameter STAT4 only
    **   Next csr
    **   if !eof(csr) goto next_row;
    */
#ifdef SQLITE_ENABLE_STAT4
    if( OptimizationEnabled(db, SQLITE_Stat4) ){
      assert( regRowid==(regStat+2) );
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp2(v, OP_IdxRowid, iIdxCur, regRowid);
      }else{
        Index *pPk = sqlite3PrimaryKeyIndex(pIdx->pTable);
        int j, k, regKey;
        regKey = sqlite3GetTempRange(pParse, pPk->nKeyCol);
        for(j=0; j<pPk->nKeyCol; j++){
          k = sqlite3TableColumnToIndex(pIdx, pPk->aiColumn[j]);
          assert( k>=0 && k<pIdx->nColumn );
          sqlite3VdbeAddOp3(v, OP_Column, iIdxCur, k, regKey+j);
          analyzeVdbeCommentIndexWithColumnName(v,pIdx,k);
        }
        sqlite3VdbeAddOp3(v, OP_MakeRecord, regKey, pPk->nKeyCol, regRowid);
        sqlite3ReleaseTempRange(pParse, regKey, pPk->nKeyCol);
      }
    }
#endif
    assert( regChng==(regStat+1) );
    {
      sqlite3VdbeAddFunctionCall(pParse, 1, regStat, regTemp, 2+IsStat4,
                                 &statPushFuncdef, 0);
      if( db->nAnalysisLimit ){
        int j1, j2, j3;
        j1 = sqlite3VdbeAddOp1(v, OP_IsNull, regTemp); VdbeCoverage(v);
        j2 = sqlite3VdbeAddOp1(v, OP_If, regTemp); VdbeCoverage(v);
        j3 = sqlite3VdbeAddOp4Int(v, OP_SeekGT, iIdxCur, 0, regPrev, 1);
        VdbeCoverage(v);
        sqlite3VdbeJumpHere(v, j1);
        sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);
        sqlite3VdbeJumpHere(v, j2);
        sqlite3VdbeJumpHere(v, j3);
      }else{
        sqlite3VdbeAddOp2(v, OP_Next, iIdxCur, addrNextRow); VdbeCoverage(v);
      }
    }

    /* Add the entry to the stat1 table. */
    if( pIdx->pPartIdxWhere ){
      /* Partial indexes might get a zero-entry in sqlite_stat1.  But
      ** an empty table is omitted from sqlite_stat1. */
      sqlite3VdbeJumpHere(v, addrGotoEnd);
      addrGotoEnd = 0;
    }
    callStatGet(pParse, regStat, STAT_GET_STAT1, regStat1);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    sqlite3VdbeChangeP4(v, -1, (char*)pStat1, P4_TABLE);
#endif
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);

    /* Add the entries to the stat4 table. */
#ifdef SQLITE_ENABLE_STAT4
    if( OptimizationEnabled(db, SQLITE_Stat4) && db->nAnalysisLimit==0 ){
      int regEq = regStat1;
      int regLt = regStat1+1;
      int regDLt = regStat1+2;
      int regSample = regStat1+3;
      int regCol = regStat1+4;
      int regSampleRowid = regCol + nCol;
      int addrNext;
      int addrIsNull;
      u8 seekOp = HasRowid(pTab) ? OP_NotExists : OP_NotFound;

      /* No STAT4 data is generated if the number of rows is zero */
      if( addrGotoEnd==0 ){
        sqlite3VdbeAddOp2(v, OP_Cast, regStat1, SQLITE_AFF_INTEGER);
        addrGotoEnd = sqlite3VdbeAddOp1(v, OP_IfNot, regStat1);
        VdbeCoverage(v);
      }

      if( doOnce ){
        int mxCol = nCol;
        Index *pX;

        /* Compute the maximum number of columns in any index */
        for(pX=pTab->pIndex; pX; pX=pX->pNext){
          int nColX;                     /* Number of columns in pX */
          if( !HasRowid(pTab) && IsPrimaryKeyIndex(pX) ){
            nColX = pX->nKeyCol;
          }else{
            nColX = pX->nColumn;
          }
          if( nColX>mxCol ) mxCol = nColX;
        }

        /* Allocate space to compute results for the largest index */
        sqlite3TouchRegister(pParse, regCol+mxCol);
        doOnce = 0;
#ifdef SQLITE_DEBUG
        /* Verify that the call to sqlite3ClearTempRegCache() below
        ** really is needed.
        ** https://sqlite.org/forum/forumpost/83cb4a95a0 (2023-03-25)
        */
        testcase( !sqlite3NoTempsInRange(pParse, regEq, regCol+mxCol) );
#endif
        sqlite3ClearTempRegCache(pParse);  /* tag-20230325-1 */
        assert( sqlite3NoTempsInRange(pParse, regEq, regCol+mxCol) );
      }
      assert( sqlite3NoTempsInRange(pParse, regEq, regCol+nCol) );

      addrNext = sqlite3VdbeCurrentAddr(v);
      callStatGet(pParse, regStat, STAT_GET_ROWID, regSampleRowid);
      addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regSampleRowid);
      VdbeCoverage(v);
      callStatGet(pParse, regStat, STAT_GET_NEQ, regEq);
      callStatGet(pParse, regStat, STAT_GET_NLT, regLt);
      callStatGet(pParse, regStat, STAT_GET_NDLT, regDLt);
      sqlite3VdbeAddOp4Int(v, seekOp, iTabCur, addrNext, regSampleRowid, 0);
      VdbeCoverage(v);
      for(i=0; i<nCol; i++){
        sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iTabCur, i, regCol+i);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regCol, nCol, regSample);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTabname, 6, regTemp);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur+1, regNewRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iStatCur+1, regTemp, regNewRowid);
      sqlite3VdbeAddOp2(v, OP_Goto, 1, addrNext); /* P1==1 for end-of-loop */
      sqlite3VdbeJumpHere(v, addrIsNull);
    }
#endif /* SQLITE_ENABLE_STAT4 */

    /* End of analysis */
    if( addrGotoEnd ) sqlite3VdbeJumpHere(v, addrGotoEnd);
  }


  /* Create a single sqlite_stat1 entry containing NULL as the index
  ** name and the row count as the content.
  */
  if( pOnlyIdx==0 && needTableCnt ){
    VdbeComment((v, "%s", pTab->zName));
    sqlite3VdbeAddOp2(v, OP_Count, iTabCur, regStat1);
    jZeroRows = sqlite3VdbeAddOp1(v, OP_IfNot, regStat1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Null, 0, regIdxname);
    assert( "BBB"[0]==SQLITE_AFF_TEXT );
    sqlite3VdbeAddOp4(v, OP_MakeRecord, regTabname, 3, regTemp, "BBB", 0);
    sqlite3VdbeAddOp2(v, OP_NewRowid, iStatCur, regNewRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, iStatCur, regTemp, regNewRowid);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    sqlite3VdbeChangeP4(v, -1, (char*)pStat1, P4_TABLE);
#endif
    sqlite3VdbeJumpHere(v, jZeroRows);
  }
}